

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

void __thiscall wasm::Wasm2JSBuilder::addMemoryGrowFunc(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  Value *pVVar1;
  pointer puVar2;
  ValueBuilder *this_00;
  size_t sVar3;
  ValueBuilder *this_01;
  size_t sVar4;
  bool bVar5;
  Ref RVar6;
  Ref *pRVar7;
  Ref RVar8;
  Ref RVar9;
  Ref RVar10;
  Ref RVar11;
  char *in_RCX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  Ref in_R8;
  IString name;
  IString name_00;
  IString name_01;
  IString target;
  IString name_02;
  IString name_03;
  IString name_04;
  IString name_05;
  IString name_06;
  IString name_07;
  IString target_00;
  IString target_01;
  IString name_08;
  IString name_09;
  IString name_10;
  IString name_11;
  IString name_12;
  IString name_13;
  IString name_14;
  IString name_15;
  IString name_16;
  IString name_17;
  IString name_18;
  IString name_19;
  IString name_20;
  IString name_21;
  IString name_22;
  IString name_23;
  IString name_24;
  IString name_25;
  IString name_26;
  IString name_27;
  IString view;
  IString view_00;
  IString view_01;
  IString view_02;
  IString view_03;
  IString view_04;
  IString view_05;
  IString view_06;
  IString arg;
  IString op;
  IString name_28;
  IString op_00;
  IString name_29;
  IString op_01;
  IString op_02;
  IString op_03;
  IString name_30;
  IString name_31;
  IString key;
  IString op_04;
  IString op_05;
  IString op_06;
  IString local_1b8;
  IString local_1a8;
  IString local_198;
  IString local_188;
  IString local_178;
  IString local_168;
  IString local_158;
  IString local_148;
  IString local_138;
  IString local_128;
  IString local_118;
  IString local_108;
  IString local_f8;
  IString local_e8;
  IString local_d8;
  IString local_c8;
  IString local_b8;
  IString local_a8;
  IString local_98;
  IString local_88;
  IString local_78;
  anon_class_8_1_a7b1b3ad local_68;
  anon_class_8_1_a7b1b3ad setHeap;
  Ref local_50;
  Ref memoryGrowFunc;
  Ref block;
  char *extraout_RDX_11;
  
  name.str._M_str = (char *)wasm;
  name.str._M_len = DAT_01174dc8;
  setHeap.block = (Ref *)ast.inst;
  RVar6 = cashew::ValueBuilder::makeFunction(WASM_MEMORY_GROW,name);
  local_50 = RVar6;
  IString::IString(&local_1b8,"pagesToAdd");
  arg.str._M_str = in_RCX;
  arg.str._M_len = (size_t)local_1b8.str._M_str;
  cashew::ValueBuilder::appendArgumentToFunction
            ((ValueBuilder *)RVar6.inst,(Ref)local_1b8.str._M_len,arg);
  pRVar7 = cashew::Ref::operator[](&local_50,3);
  pVVar1 = pRVar7->inst;
  IString::IString(&local_1a8,"pagesToAdd");
  name_00.str._M_str = extraout_RDX;
  name_00.str._M_len = (size_t)local_1a8.str._M_str;
  RVar8 = cashew::ValueBuilder::makeName((ValueBuilder *)local_1a8.str._M_len,name_00);
  sVar3 = DAT_01175560;
  RVar6.inst = cashew::SET.inst;
  IString::IString(&local_198,"pagesToAdd");
  name_01.str._M_str = extraout_RDX_00;
  name_01.str._M_len = (size_t)local_198.str._M_str;
  RVar9 = cashew::ValueBuilder::makeName((ValueBuilder *)local_198.str._M_len,name_01);
  RVar9 = makeJsCoercion(RVar9,JS_INT);
  op.str._M_str = (char *)RVar9.inst;
  op.str._M_len = sVar3;
  RVar6 = cashew::ValueBuilder::makeBinary(RVar8.inst,RVar6,op,in_R8);
  cashew::Value::push_back(pVVar1,RVar6);
  RVar6 = cashew::ValueBuilder::makeVar(false);
  pRVar7 = cashew::Ref::operator[](&local_50,3);
  cashew::Value::push_back(pRVar7->inst,RVar6);
  IString::IString(&local_188,"oldPages");
  target.str._M_str = extraout_RDX_01;
  target.str._M_len = DAT_01174dd8;
  RVar8 = cashew::ValueBuilder::makeCall(WASM_MEMORY_SIZE,target);
  RVar8 = makeJsCoercion(RVar8,JS_INT);
  name_28.str._M_str = (char *)RVar8.inst;
  name_28.str._M_len = (size_t)local_188.str._M_str;
  cashew::ValueBuilder::appendToVar
            ((ValueBuilder *)RVar6.inst,(Ref)local_188.str._M_len,name_28,in_R8);
  RVar8 = cashew::ValueBuilder::makeVar(false);
  pRVar7 = cashew::Ref::operator[](&local_50,3);
  cashew::Value::push_back(pRVar7->inst,RVar8);
  IString::IString(&local_88,"newPages");
  IString::IString(&local_178,"oldPages");
  name_02.str._M_str = extraout_RDX_02;
  name_02.str._M_len = (size_t)local_178.str._M_str;
  RVar9 = cashew::ValueBuilder::makeName((ValueBuilder *)local_178.str._M_len,name_02);
  sVar3 = DAT_01175290;
  RVar6.inst = cashew::PLUS.inst;
  IString::IString(&local_168,"pagesToAdd");
  name_03.str._M_str = extraout_RDX_03;
  name_03.str._M_len = (size_t)local_168.str._M_str;
  RVar10 = cashew::ValueBuilder::makeName((ValueBuilder *)local_168.str._M_len,name_03);
  op_00.str._M_str = (char *)RVar10.inst;
  op_00.str._M_len = sVar3;
  RVar6 = cashew::ValueBuilder::makeBinary(RVar9.inst,RVar6,op_00,in_R8);
  RVar6 = makeJsCoercion(RVar6,JS_INT);
  name_29.str._M_str = (char *)RVar6.inst;
  name_29.str._M_len = (size_t)local_88.str._M_str;
  cashew::ValueBuilder::appendToVar
            ((ValueBuilder *)RVar8.inst,(Ref)local_88.str._M_len,name_29,in_R8);
  RVar8 = cashew::ValueBuilder::makeBlock();
  memoryGrowFunc.inst = RVar8.inst;
  pRVar7 = cashew::Ref::operator[](&local_50,3);
  pVVar1 = pRVar7->inst;
  IString::IString(&local_158,"oldPages");
  name_04.str._M_str = extraout_RDX_04;
  name_04.str._M_len = (size_t)local_158.str._M_str;
  RVar9 = cashew::ValueBuilder::makeName((ValueBuilder *)local_158.str._M_len,name_04);
  sVar3 = DAT_01175300;
  RVar6.inst = cashew::LT.inst;
  IString::IString(&local_148,"newPages");
  name_05.str._M_str = extraout_RDX_05;
  name_05.str._M_len = (size_t)local_148.str._M_str;
  RVar10 = cashew::ValueBuilder::makeName((ValueBuilder *)local_148.str._M_len,name_05);
  op_01.str._M_str = (char *)RVar10.inst;
  op_01.str._M_len = sVar3;
  RVar9 = cashew::ValueBuilder::makeBinary(RVar9.inst,RVar6,op_01,in_R8);
  IString::IString(&local_138,"&&");
  IString::IString(&local_128,"newPages");
  name_06.str._M_str = extraout_RDX_06;
  name_06.str._M_len = (size_t)local_128.str._M_str;
  RVar10 = cashew::ValueBuilder::makeName((ValueBuilder *)local_128.str._M_len,name_06);
  sVar3 = DAT_01175300;
  RVar6.inst = cashew::LT.inst;
  RVar11 = cashew::ValueBuilder::makeDouble(65536.0);
  op_02.str._M_str = (char *)RVar11.inst;
  op_02.str._M_len = sVar3;
  RVar6 = cashew::ValueBuilder::makeBinary(RVar10.inst,RVar6,op_02,in_R8);
  op_03.str._M_str = (char *)RVar6.inst;
  op_03.str._M_len = (size_t)local_138.str._M_str;
  RVar6 = cashew::ValueBuilder::makeBinary(RVar9.inst,(Ref)local_138.str._M_len,op_03,in_R8);
  RVar6 = cashew::ValueBuilder::makeIf(RVar6,RVar8,(Ref)0x0);
  cashew::Value::push_back(pVVar1,RVar6);
  RVar6 = cashew::ValueBuilder::makeVar(false);
  cashew::ValueBuilder::appendToBlock(RVar8,RVar6);
  IString::IString(&local_78,"newBuffer");
  sVar4 = DAT_01174c98;
  this_01 = MATH_IMUL;
  sVar3 = DAT_01174a58;
  this_00 = ARRAY_BUFFER;
  IString::IString(&local_118,"newPages");
  name_07.str._M_str = extraout_RDX_07;
  name_07.str._M_len = (size_t)local_118.str._M_str;
  RVar9 = cashew::ValueBuilder::makeName((ValueBuilder *)local_118.str._M_len,name_07);
  RVar10 = cashew::ValueBuilder::makeDouble(65536.0);
  target_00.str._M_str = (char *)RVar9.inst;
  target_00.str._M_len = sVar4;
  RVar9 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>(this_01,target_00,RVar10,in_R8);
  target_01.str._M_str = (char *)RVar9.inst;
  target_01.str._M_len = sVar3;
  RVar9 = cashew::ValueBuilder::makeCall<cashew::Ref>(this_00,target_01,RVar10);
  RVar9 = cashew::ValueBuilder::makeNew(RVar9);
  name_30.str._M_str = (char *)RVar9.inst;
  name_30.str._M_len = (size_t)local_78.str._M_str;
  cashew::ValueBuilder::appendToVar
            ((ValueBuilder *)RVar6.inst,(Ref)local_78.str._M_len,name_30,in_R8);
  RVar6 = cashew::ValueBuilder::makeVar(false);
  cashew::ValueBuilder::appendToBlock(RVar8,RVar6);
  IString::IString(&local_108,"newHEAP8");
  name_08.str._M_str = extraout_RDX_08;
  name_08.str._M_len = (size_t)DAT_011749d8;
  RVar9 = cashew::ValueBuilder::makeName(INT8ARRAY,name_08);
  IString::IString(&local_f8,"newBuffer");
  name_09.str._M_str = extraout_RDX_09;
  name_09.str._M_len = (size_t)local_f8.str._M_str;
  RVar10 = cashew::ValueBuilder::makeName((ValueBuilder *)local_f8.str._M_len,name_09);
  RVar9 = cashew::ValueBuilder::makeCall(RVar9,RVar10);
  RVar9 = cashew::ValueBuilder::makeNew(RVar9);
  name_31.str._M_str = (char *)RVar9.inst;
  name_31.str._M_len = (size_t)local_108.str._M_str;
  cashew::ValueBuilder::appendToVar
            ((ValueBuilder *)RVar6.inst,(Ref)local_108.str._M_len,name_31,in_R8);
  IString::IString(&local_e8,"newHEAP8");
  name_10.str._M_str = extraout_RDX_10;
  name_10.str._M_len = (size_t)local_e8.str._M_str;
  RVar6 = cashew::ValueBuilder::makeName((ValueBuilder *)local_e8.str._M_len,name_10);
  IString::IString(&local_d8,"set");
  key.str._M_str = (char *)RVar9.inst;
  key.str._M_len = (size_t)local_d8.str._M_str;
  RVar6 = cashew::ValueBuilder::makeDot(RVar6.inst,(Ref)local_d8.str._M_len,key);
  name_11.str._M_str = extraout_RDX_11;
  name_11.str._M_len = (size_t)DAT_011753c0;
  RVar9 = cashew::ValueBuilder::makeName(cashew::HEAP8,name_11);
  RVar6 = cashew::ValueBuilder::makeCall(RVar6,RVar9);
  cashew::ValueBuilder::appendToBlock(RVar8,RVar6);
  local_68.block = &memoryGrowFunc;
  name_12.str._M_str = DAT_011753c0;
  name_12.str._M_len = (size_t)cashew::HEAP8;
  view.str._M_str = DAT_011749d8;
  view.str._M_len = (size_t)INT8ARRAY;
  addMemoryGrowFunc::anon_class_8_1_a7b1b3ad::operator()(&local_68,name_12,view);
  name_13.str._M_str = DAT_011753d0;
  name_13.str._M_len = cashew::HEAP16;
  view_00.str._M_str = DAT_011749e8;
  view_00.str._M_len = INT16ARRAY;
  addMemoryGrowFunc::anon_class_8_1_a7b1b3ad::operator()(&local_68,name_13,view_00);
  name_14.str._M_str = DAT_011753e0;
  name_14.str._M_len = cashew::HEAP32;
  view_01.str._M_str = DAT_011749f8;
  view_01.str._M_len = INT32ARRAY;
  addMemoryGrowFunc::anon_class_8_1_a7b1b3ad::operator()(&local_68,name_14,view_01);
  name_15.str._M_str = DAT_01175400;
  name_15.str._M_len = (size_t)cashew::HEAPU8;
  view_02.str._M_str = DAT_01174a08;
  view_02.str._M_len = UINT8ARRAY;
  addMemoryGrowFunc::anon_class_8_1_a7b1b3ad::operator()(&local_68,name_15,view_02);
  name_16.str._M_str = DAT_01175410;
  name_16.str._M_len = cashew::HEAPU16;
  view_03.str._M_str = DAT_01174a18;
  view_03.str._M_len = UINT16ARRAY;
  addMemoryGrowFunc::anon_class_8_1_a7b1b3ad::operator()(&local_68,name_16,view_03);
  name_17.str._M_str = DAT_01175420;
  name_17.str._M_len = cashew::HEAPU32;
  view_04.str._M_str = DAT_01174a28;
  view_04.str._M_len = UINT32ARRAY;
  addMemoryGrowFunc::anon_class_8_1_a7b1b3ad::operator()(&local_68,name_17,view_04);
  name_18.str._M_str = DAT_011753f0;
  name_18.str._M_len = cashew::HEAPF32;
  view_05.str._M_str = DAT_01174a38;
  view_05.str._M_len = FLOAT32ARRAY;
  addMemoryGrowFunc::anon_class_8_1_a7b1b3ad::operator()(&local_68,name_18,view_05);
  name_19.str._M_str = DAT_01175430;
  name_19.str._M_len = cashew::HEAPF64;
  view_06.str._M_str = (char *)DAT_01174a48;
  view_06.str._M_len = FLOAT64ARRAY;
  RVar9.inst = DAT_01174a48;
  addMemoryGrowFunc::anon_class_8_1_a7b1b3ad::operator()(&local_68,name_19,view_06);
  RVar8 = memoryGrowFunc;
  name_20.str._M_str = extraout_RDX_12;
  name_20.str._M_len = DAT_01174c38;
  RVar10 = cashew::ValueBuilder::makeName(BUFFER,name_20);
  sVar3 = DAT_01175560;
  RVar6.inst = cashew::SET.inst;
  IString::IString(&local_c8,"newBuffer");
  name_21.str._M_str = extraout_RDX_13;
  name_21.str._M_len = (size_t)local_c8.str._M_str;
  RVar11 = cashew::ValueBuilder::makeName((ValueBuilder *)local_c8.str._M_len,name_21);
  op_04.str._M_str = (char *)RVar11.inst;
  op_04.str._M_len = sVar3;
  RVar6 = cashew::ValueBuilder::makeBinary(RVar10.inst,RVar6,op_04,RVar9);
  cashew::ValueBuilder::appendToBlock(RVar8,RVar6);
  RVar6 = memoryGrowFunc;
  puVar2 = (wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((puVar2 != (wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
     (*(char **)((long)&(((puVar2->_M_t).
                          super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                          .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                        super_Importable).module + 8) != (char *)0x0)) {
    IString::IString(&local_b8,"memory");
    name_22.str._M_str = extraout_RDX_14;
    name_22.str._M_len = (size_t)local_b8.str._M_str;
    RVar8 = cashew::ValueBuilder::makeName((ValueBuilder *)local_b8.str._M_len,name_22);
    name_23.str._M_str = extraout_RDX_15;
    name_23.str._M_len = DAT_01174c38;
    RVar10 = cashew::ValueBuilder::makeName(BUFFER,name_23);
    RVar10 = cashew::ValueBuilder::makeDot(RVar8,RVar10);
    sVar3 = DAT_01175560;
    RVar8.inst = cashew::SET.inst;
    name_24.str._M_str = extraout_RDX_16;
    name_24.str._M_len = DAT_01174c38;
    RVar11 = cashew::ValueBuilder::makeName(BUFFER,name_24);
    op_05.str._M_str = (char *)RVar11.inst;
    op_05.str._M_len = sVar3;
    RVar8 = cashew::ValueBuilder::makeBinary(RVar10.inst,RVar8,op_05,RVar9);
    cashew::ValueBuilder::appendToBlock(RVar6,RVar8);
  }
  bVar5 = needsBufferView(wasm);
  RVar6 = memoryGrowFunc;
  if (bVar5) {
    IString::IString(&local_a8,"bufferView");
    name_25.str._M_str = extraout_RDX_17;
    name_25.str._M_len = (size_t)local_a8.str._M_str;
    RVar10 = cashew::ValueBuilder::makeName((ValueBuilder *)local_a8.str._M_len,name_25);
    sVar3 = DAT_01175560;
    RVar8.inst = cashew::SET.inst;
    name_26.str._M_str = extraout_RDX_18;
    name_26.str._M_len = (size_t)DAT_01175400;
    RVar11 = cashew::ValueBuilder::makeName(cashew::HEAPU8,name_26);
    op_06.str._M_str = (char *)RVar11.inst;
    op_06.str._M_len = sVar3;
    RVar8 = cashew::ValueBuilder::makeBinary(RVar10.inst,RVar8,op_06,RVar9);
    cashew::ValueBuilder::appendToBlock(RVar6,RVar8);
  }
  pRVar7 = cashew::Ref::operator[](&local_50,3);
  pVVar1 = pRVar7->inst;
  IString::IString(&local_98,"oldPages");
  name_27.str._M_str = extraout_RDX_19;
  name_27.str._M_len = (size_t)local_98.str._M_str;
  RVar6 = cashew::ValueBuilder::makeName((ValueBuilder *)local_98.str._M_len,name_27);
  RVar6 = cashew::ValueBuilder::makeReturn(RVar6);
  cashew::Value::push_back(pVVar1,RVar6);
  cashew::Value::push_back((Value *)setHeap.block,local_50);
  return;
}

Assistant:

void Wasm2JSBuilder::addMemoryGrowFunc(Ref ast, Module* wasm) {
  Ref memoryGrowFunc = ValueBuilder::makeFunction(WASM_MEMORY_GROW);
  ValueBuilder::appendArgumentToFunction(memoryGrowFunc, IString("pagesToAdd"));

  memoryGrowFunc[3]->push_back(
    ValueBuilder::makeStatement(ValueBuilder::makeBinary(
      ValueBuilder::makeName(IString("pagesToAdd")),
      SET,
      makeJsCoercion(ValueBuilder::makeName(IString("pagesToAdd")),
                     JsType::JS_INT))));

  Ref oldPages = ValueBuilder::makeVar();
  memoryGrowFunc[3]->push_back(oldPages);
  ValueBuilder::appendToVar(
    oldPages,
    IString("oldPages"),
    makeJsCoercion(ValueBuilder::makeCall(WASM_MEMORY_SIZE), JsType::JS_INT));

  Ref newPages = ValueBuilder::makeVar();
  memoryGrowFunc[3]->push_back(newPages);
  ValueBuilder::appendToVar(
    newPages,
    IString("newPages"),
    makeJsCoercion(
      ValueBuilder::makeBinary(ValueBuilder::makeName(IString("oldPages")),
                               PLUS,
                               ValueBuilder::makeName(IString("pagesToAdd"))),
      JsType::JS_INT));

  Ref block = ValueBuilder::makeBlock();
  memoryGrowFunc[3]->push_back(ValueBuilder::makeIf(
    ValueBuilder::makeBinary(
      ValueBuilder::makeBinary(ValueBuilder::makeName(IString("oldPages")),
                               LT,
                               ValueBuilder::makeName(IString("newPages"))),
      IString("&&"),
      ValueBuilder::makeBinary(ValueBuilder::makeName(IString("newPages")),
                               LT,
                               ValueBuilder::makeInt(Memory::kMaxSize32))),
    block,
    NULL));

  Ref newBuffer = ValueBuilder::makeVar();
  ValueBuilder::appendToBlock(block, newBuffer);
  ValueBuilder::appendToVar(
    newBuffer,
    IString("newBuffer"),
    ValueBuilder::makeNew(ValueBuilder::makeCall(
      ARRAY_BUFFER,
      ValueBuilder::makeCall(MATH_IMUL,
                             ValueBuilder::makeName(IString("newPages")),
                             ValueBuilder::makeInt(Memory::kPageSize)))));

  Ref newHEAP8 = ValueBuilder::makeVar();
  ValueBuilder::appendToBlock(block, newHEAP8);
  ValueBuilder::appendToVar(newHEAP8,
                            IString("newHEAP8"),
                            ValueBuilder::makeNew(ValueBuilder::makeCall(
                              ValueBuilder::makeName(INT8ARRAY),
                              ValueBuilder::makeName(IString("newBuffer")))));

  ValueBuilder::appendToBlock(
    block,
    ValueBuilder::makeCall(
      ValueBuilder::makeDot(ValueBuilder::makeName(IString("newHEAP8")),
                            IString("set")),
      ValueBuilder::makeName(HEAP8)));

  auto setHeap = [&](IString name, IString view) {
    ValueBuilder::appendToBlock(
      block,
      ValueBuilder::makeBinary(
        ValueBuilder::makeName(name),
        SET,
        ValueBuilder::makeNew(ValueBuilder::makeCall(
          ValueBuilder::makeName(view),
          ValueBuilder::makeName(IString("newBuffer"))))));
  };

  setHeap(HEAP8, INT8ARRAY);
  setHeap(HEAP16, INT16ARRAY);
  setHeap(HEAP32, INT32ARRAY);
  setHeap(HEAPU8, UINT8ARRAY);
  setHeap(HEAPU16, UINT16ARRAY);
  setHeap(HEAPU32, UINT32ARRAY);
  setHeap(HEAPF32, FLOAT32ARRAY);
  setHeap(HEAPF64, FLOAT64ARRAY);

  ValueBuilder::appendToBlock(
    block,
    ValueBuilder::makeBinary(ValueBuilder::makeName(BUFFER),
                             SET,
                             ValueBuilder::makeName(IString("newBuffer"))));

  // apply the changes to the memory import
  if (!wasm->memories.empty() && wasm->memories[0]->imported()) {
    ValueBuilder::appendToBlock(
      block,
      ValueBuilder::makeBinary(
        ValueBuilder::makeDot(ValueBuilder::makeName("memory"),
                              ValueBuilder::makeName(BUFFER)),
        SET,
        ValueBuilder::makeName(BUFFER)));
  }

  if (needsBufferView(*wasm)) {
    ValueBuilder::appendToBlock(
      block,
      ValueBuilder::makeBinary(ValueBuilder::makeName("bufferView"),
                               SET,
                               ValueBuilder::makeName(HEAPU8)));
  }

  memoryGrowFunc[3]->push_back(
    ValueBuilder::makeReturn(ValueBuilder::makeName(IString("oldPages"))));

  ast->push_back(memoryGrowFunc);
}